

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O1

bsp_size_t bsp_hpmove(void **tag_ptr,void **payload_ptr)

{
  pointer ppVar1;
  pointer ppVar2;
  ulong uVar3;
  Bsmp *pBVar4;
  ulong uVar5;
  unsigned_long uVar6;
  TicToc t;
  Time t_1;
  TicToc local_48;
  timespec local_28;
  
  if ((s_spmd == (Spmd *)0x0) || (s_spmd->m_closed == true)) {
    bsp_abort("bsp_hpmove: can only be called within SPMD section\n");
  }
  local_48.m_record = bsplib::TicToc::push(BSMP);
  clock_gettime(1,&local_28);
  local_48.m_start.tv_sec._0_4_ = (undefined4)local_28.tv_sec;
  local_48.m_start.tv_sec._4_4_ = local_28.tv_sec._4_4_;
  local_48.m_start.tv_nsec._0_4_ = (undefined4)local_28.tv_nsec;
  local_48.m_start.tv_nsec._4_4_ = local_28.tv_nsec._4_4_;
  local_48.m_nbytes = 0;
  if (tag_ptr == (void **)0x0 || payload_ptr == (void **)0x0) {
    bsp_abort("bsp_hpmove: pointer arugments may not be NULL\n");
  }
  pBVar4 = s_bsmp;
  ppVar1 = (s_bsmp->m_payloads).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (s_bsmp->m_payloads).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar1 == ppVar2) {
    uVar6 = 0xffffffff;
  }
  else {
    local_48.m_nbytes = local_48.m_nbytes + ppVar2[-1].second;
    uVar3 = (s_bsmp->m_tag_buffer).m_alignment;
    uVar5 = (s_bsmp->m_recv_tag_size + uVar3) - 1;
    *tag_ptr = (void *)((uVar5 - uVar5 % uVar3) * (((long)ppVar2 - (long)ppVar1 >> 4) + -1) +
                       (long)(s_bsmp->m_tag_buffer).m_aligned_ptr);
    *payload_ptr = (void *)((long)(pBVar4->m_payload_buffer).m_aligned_ptr +
                           (pBVar4->m_payloads).
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].first);
    ppVar1 = (pBVar4->m_payloads).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar6 = ppVar1[-1].second;
    pBVar4->m_total_n_messages = pBVar4->m_total_n_messages - 1;
    pBVar4->m_total_payload = pBVar4->m_total_payload - uVar6;
    (pBVar4->m_payloads).
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar1 + -1;
  }
  bsplib::TicToc::~TicToc(&local_48);
  return (bsp_size_t)uVar6;
}

Assistant:

bsp_size_t bsp_hpmove( void ** tag_ptr, void ** payload_ptr )
{
     if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_hpmove: can only be called within SPMD section\n");

#ifdef PROFILE
     TicToc t( TicToc::BSMP );
#endif

     if ( tag_ptr == NULL || payload_ptr == NULL )
        bsp_abort("bsp_hpmove: pointer arugments may not be NULL\n");

     if ( s_bsmp->empty() )
         return bsp_size_t(-1);

#ifdef PROFILE
     t.add_bytes( s_bsmp->payload_size() );
#endif

     *tag_ptr = s_bsmp->tag();
     *payload_ptr = s_bsmp->payload();
     size_t size = s_bsmp->payload_size();
     s_bsmp->pop();
     return static_cast<bsp_size_t>( size );
}